

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O3

S2CellUnion * __thiscall
S2CellUnion::Intersection(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellId id)

{
  iterator __position;
  pointer pSVar1;
  bool bVar2;
  pointer pSVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer __args;
  S2CellId local_48;
  S2LogMessage local_40;
  
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2CellUnion_002bb848
  ;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.id_ = id.id_;
  bVar2 = Contains(this,id);
  if (bVar2) {
    std::vector<S2CellId,std::allocator<S2CellId>>::_M_realloc_insert<S2CellId_const&>
              ((vector<S2CellId,std::allocator<S2CellId>> *)&__return_storage_ptr__->cell_ids_,
               (iterator)0x0,&local_48);
  }
  else {
    __args = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar3 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = ~id.id_ & id.id_ - 1;
    uVar4 = (long)pSVar3 - (long)__args >> 3;
    if (0 < (long)uVar4) {
      do {
        uVar6 = uVar4 >> 1;
        uVar4 = ~uVar6 + uVar4;
        pSVar1 = __args + uVar6 + 1;
        if (id.id_ - uVar5 <= __args[uVar6].id_) {
          uVar4 = uVar6;
          pSVar1 = __args;
        }
        __args = pSVar1;
      } while (0 < (long)uVar4);
    }
    if (__args != pSVar3) {
      do {
        if (uVar5 + id.id_ < __args->id_) break;
        __position._M_current =
             (__return_storage_ptr__->cell_ids_).
             super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data
             ._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->cell_ids_).
            super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<S2CellId,std::allocator<S2CellId>>::_M_realloc_insert<S2CellId_const&>
                    ((vector<S2CellId,std::allocator<S2CellId>> *)&__return_storage_ptr__->cell_ids_
                     ,__position,__args);
          pSVar3 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        }
        else {
          (__position._M_current)->id_ = __args->id_;
          (__return_storage_ptr__->cell_ids_).
          super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
        __args = __args + 1;
      } while (__args != pSVar3);
    }
  }
  bVar2 = IsNormalized(__return_storage_ptr__);
  if ((!bVar2) && (bVar2 = IsNormalized(this), bVar2)) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_union.cc"
               ,0x13a,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: result.IsNormalized() || !IsNormalized() ",0x37);
    abort();
  }
  return __return_storage_ptr__;
}

Assistant:

S2CellUnion S2CellUnion::Intersection(S2CellId id) const {
  S2CellUnion result;
  if (Contains(id)) {
    result.cell_ids_.push_back(id);
  } else {
    vector<S2CellId>::const_iterator i = std::lower_bound(
        cell_ids_.begin(), cell_ids_.end(), id.range_min());
    S2CellId id_max = id.range_max();
    while (i != cell_ids_.end() && *i <= id_max)
      result.cell_ids_.push_back(*i++);
  }
  S2_DCHECK(result.IsNormalized() || !IsNormalized());
  return result;
}